

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContextTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::SpanContext_testDebug_Test::TestBody(SpanContext_testDebug_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult local_168 [2];
  AssertHelper local_148 [8];
  Message local_140 [15];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  AssertionResult local_118 [2];
  AssertHelper local_f8 [8];
  Message local_f0 [31];
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  SpanContext spanContext;
  SpanContext_testDebug_Test *this_local;
  
  SpanContext::SpanContext((SpanContext *)&gtest_ar_.message_);
  bVar1 = SpanContext::isDebug((SpanContext *)&gtest_ar_.message_);
  local_d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_118,local_d0,"spanContext.isDebug()","true");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    std::__cxx11::string::~string((string *)local_118);
    testing::Message::~Message(local_f0);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    bVar1 = SpanContext::isDebugIDContainerOnly((SpanContext *)&gtest_ar_.message_);
    local_131 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_130,&local_131,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(local_140);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_168,local_130,"spanContext.isDebugIDContainerOnly()","true");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                 ,0x72,pcVar2);
      testing::internal::AssertHelper::operator=(local_148,local_140);
      testing::internal::AssertHelper::~AssertHelper(local_148);
      std::__cxx11::string::~string((string *)local_168);
      testing::Message::~Message(local_140);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      gtest_ar__1.message_.ptr_._4_4_ = 0;
    }
  }
  SpanContext::~SpanContext((SpanContext *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SpanContext, testDebug)
{
    const SpanContext spanContext;
    ASSERT_FALSE(spanContext.isDebug());
    ASSERT_FALSE(spanContext.isDebugIDContainerOnly());
}